

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxc.cxx
# Opt level: O0

void __thiscall
ExchCXX::detail::LibxcKernelImpl::eval_exc_
          (LibxcKernelImpl *this,int N,const_host_buffer_type rho,host_buffer_type eps)

{
  undefined8 uVar1;
  bool bVar2;
  double *in_RDI;
  undefined6 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  string *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  string *in_stack_ffffffffffffff98;
  exchcxx_exception *in_stack_ffffffffffffffa0;
  LibxcKernelImpl *in_stack_ffffffffffffffd0;
  
  throw_if_uninitialized(in_stack_ffffffffffffffd0);
  bVar2 = XCKernelImpl::is_lda((XCKernelImpl *)0x25ba92);
  if (!bVar2) {
    uVar1 = __cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    exchcxx_exception::exchcxx_exception
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
               in_stack_ffffffffffffff88);
    __cxa_throw(uVar1,&exchcxx_exception::typeinfo,exchcxx_exception::~exchcxx_exception);
  }
  xc_lda_exc((xc_func_type *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             (size_t)in_stack_ffffffffffffff88,
             (double *)
             CONCAT17(in_stack_ffffffffffffff87,
                      CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)),in_RDI);
  return;
}

Assistant:

LDA_EXC_GENERATOR( LibxcKernelImpl::eval_exc_ ) const {

  throw_if_uninitialized();
  EXCHCXX_BOOL_CHECK("KERNEL IS NOT LDA",  is_lda() );
  xc_lda_exc( &kernel_, N, rho, eps );

}